

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffercache.h
# Opt level: O0

int * __thiscall
pbrt::BufferCache<int>::LookupOrAdd(BufferCache<int> *this,vector<int,_std::allocator<int>_> *buf)

{
  bool bVar1;
  int *piVar2;
  size_type sVar3;
  pointer pBVar4;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  unordered_set<pbrt::BufferCache<int>::Buffer,_pbrt::BufferCache<int>::BufferHasher,_std::equal_to<pbrt::BufferCache<int>::Buffer>,_std::allocator<pbrt::BufferCache<int>::Buffer>_>
  *this_00;
  vector<int,_std::allocator<int>_> *in_RSI;
  long in_RDI;
  long *in_FS_OFFSET;
  int *ptr;
  iterator iter;
  Buffer lookupBuffer;
  lock_guard<std::mutex> lock;
  unordered_set<pbrt::BufferCache<int>::Buffer,_pbrt::BufferCache<int>::BufferHasher,_std::equal_to<pbrt::BufferCache<int>::Buffer>,_std::allocator<pbrt::BufferCache<int>::Buffer>_>
  *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  value_type *in_stack_ffffffffffffff38;
  int *in_stack_ffffffffffffff40;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff48;
  Buffer local_80;
  int *local_70;
  int *local_68;
  int *local_60;
  undefined4 local_54;
  _Node_iterator_base<pbrt::BufferCache<int>::Buffer,_true> local_50;
  _Node_iterator_base<pbrt::BufferCache<int>::Buffer,_true> local_48 [3];
  Buffer local_30;
  vector<int,_std::allocator<int>_> *local_18;
  int *local_8;
  
  in_FS_OFFSET[-0xc0] = in_FS_OFFSET[-0xc0] + 1;
  local_18 = in_RSI;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30)
             ,(mutex_type *)in_stack_ffffffffffffff28);
  piVar2 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x597337);
  sVar3 = std::vector<int,_std::allocator<int>_>::size(local_18);
  Buffer::Buffer(&local_30,piVar2,sVar3);
  local_48[0]._M_cur =
       (__node_type *)
       std::
       unordered_set<pbrt::BufferCache<int>::Buffer,_pbrt::BufferCache<int>::BufferHasher,_std::equal_to<pbrt::BufferCache<int>::Buffer>,_std::allocator<pbrt::BufferCache<int>::Buffer>_>
       ::find(in_stack_ffffffffffffff28,(key_type *)0x597376);
  local_50._M_cur =
       (__node_type *)
       std::
       unordered_set<pbrt::BufferCache<int>::Buffer,_pbrt::BufferCache<int>::BufferHasher,_std::equal_to<pbrt::BufferCache<int>::Buffer>,_std::allocator<pbrt::BufferCache<int>::Buffer>_>
       ::end(in_stack_ffffffffffffff28);
  bVar1 = std::__detail::operator!=(local_48,&local_50);
  if (bVar1) {
    *(long *)(*in_FS_OFFSET + -0x608) = *(long *)(*in_FS_OFFSET + -0x608) + 1;
    sVar3 = std::vector<int,_std::allocator<int>_>::capacity(local_18);
    *(long *)(*in_FS_OFFSET + -0x610) = sVar3 * 4 + *(long *)(*in_FS_OFFSET + -0x610);
    pBVar4 = std::__detail::_Node_iterator<pbrt::BufferCache<int>::Buffer,_true,_true>::operator->
                       ((_Node_iterator<pbrt::BufferCache<int>::Buffer,_true,_true> *)0x59740f);
    local_8 = pBVar4->ptr;
  }
  else {
    std::vector<int,_std::allocator<int>_>::size(local_18);
    __first._M_current =
         pstd::pmr::polymorphic_allocator<std::byte>::allocate_object<int>
                   ((polymorphic_allocator<std::byte> *)
                    CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                    (size_t)in_stack_ffffffffffffff28);
    local_60 = __first._M_current;
    local_68 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff28);
    local_70 = (int *)std::vector<int,_std::allocator<int>_>::end
                                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff28);
    std::copy<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int*>
              (__first,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    sVar3 = std::vector<int,_std::allocator<int>_>::size(local_18);
    *(size_type *)(in_RDI + 0x68) = *(long *)(in_RDI + 0x68) + sVar3 * 4;
    this_00 = (unordered_set<pbrt::BufferCache<int>::Buffer,_pbrt::BufferCache<int>::BufferHasher,_std::equal_to<pbrt::BufferCache<int>::Buffer>,_std::allocator<pbrt::BufferCache<int>::Buffer>_>
               *)(in_RDI + 0x30);
    piVar2 = local_60;
    sVar3 = std::vector<int,_std::allocator<int>_>::size(local_18);
    Buffer::Buffer(&local_80,piVar2,sVar3);
    std::
    unordered_set<pbrt::BufferCache<int>::Buffer,_pbrt::BufferCache<int>::BufferHasher,_std::equal_to<pbrt::BufferCache<int>::Buffer>,_std::allocator<pbrt::BufferCache<int>::Buffer>_>
    ::insert(this_00,in_stack_ffffffffffffff38);
    local_8 = local_60;
  }
  local_54 = 1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x59755b);
  return local_8;
}

Assistant:

const T *LookupOrAdd(const std::vector<T> &buf) {
        ++nBufferCacheLookups;
        std::lock_guard<std::mutex> lock(mutex);
        // Return pointer to data if _buf_ contents is already in the cache
        Buffer lookupBuffer(buf.data(), buf.size());
        if (auto iter = cache.find(lookupBuffer); iter != cache.end()) {
            DCHECK(std::memcmp(buf.data(), iter->ptr, buf.size() * sizeof(T)) == 0);
            ++nBufferCacheHits;
            redundantBufferBytes += buf.capacity() * sizeof(T);
            return iter->ptr;
        }

        // Add _buf_ contents to cache and return pointer to cached copy
        T *ptr = alloc.allocate_object<T>(buf.size());
        std::copy(buf.begin(), buf.end(), ptr);
        bytesUsed += buf.size() * sizeof(T);
        cache.insert(Buffer(ptr, buf.size()));
        return ptr;
    }